

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Strings.cc
# Opt level: O2

string * __thiscall
phosg::StringReader::get_line_abi_cxx11_
          (string *__return_storage_ptr__,StringReader *this,bool advance)

{
  int8_t __c;
  bool bVar1;
  out_of_range *this_00;
  ulong offset;
  allocator<char> local_39;
  string local_38;
  
  if (this->length <= this->offset) {
    this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
    ::std::out_of_range::out_of_range(this_00,"end of string");
    __cxa_throw(this_00,&::std::out_of_range::typeinfo,::std::out_of_range::~out_of_range);
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  while (offset = __return_storage_ptr__->_M_string_length + this->offset, offset < this->length) {
    __c = pget_s8(this,offset);
    if (__c == '\n') break;
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::push_back
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               __return_storage_ptr__,__c);
  }
  if (advance) {
    this->offset = __return_storage_ptr__->_M_string_length + this->offset + 1;
  }
  ::std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"\r",&local_39);
  bVar1 = ends_with(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  if (bVar1) {
    ::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
              (__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

bool StringReader::eof() const {
  return (this->offset >= this->length);
}